

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O1

void __thiscall
dg::DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS>::DGLLVMPointerAnalysisImpl
          (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS> *this,PointerGraph *PS,
          LLVMPointerGraphBuilder *b,LLVMPointerAnalysisOptions *opts)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this_00;
  PointerAnalysisOptions local_70;
  
  local_70.super_AnalysisOptions.fieldSensitivity.offset =
       (opts->super_PointerAnalysisOptions).super_AnalysisOptions.fieldSensitivity.offset;
  this_00 = &local_70.super_AnalysisOptions.allocationFunctions;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&this_00->_M_t,
             &(opts->super_PointerAnalysisOptions).super_AnalysisOptions.allocationFunctions._M_t);
  local_70.preprocessGeps = (opts->super_PointerAnalysisOptions).preprocessGeps;
  local_70.invalidateNodes = (opts->super_PointerAnalysisOptions).invalidateNodes;
  local_70._58_6_ = *(undefined6 *)&(opts->super_PointerAnalysisOptions).field_0x3a;
  local_70.maxIterations = (opts->super_PointerAnalysisOptions).maxIterations;
  pta::PointerAnalysisFS::PointerAnalysisFS(&this->super_PointerAnalysisFS,PS,&local_70);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&this_00->_M_t,
             (_Link_type)
             local_70.super_AnalysisOptions.allocationFunctions._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent);
  (this->super_PointerAnalysisFS).super_PointerAnalysis._vptr_PointerAnalysis =
       (_func_int **)&PTR__PointerAnalysisFS_00134798;
  this->builder = b;
  return;
}

Assistant:

DGLLVMPointerAnalysisImpl(PointerGraph *PS, LLVMPointerGraphBuilder *b,
                              const LLVMPointerAnalysisOptions &opts)
            : PTType(PS, opts), builder(b) {}